

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O1

void __thiscall
axl::enc::Utf8Dfa::
emitPendingCus<axl::enc::Convert<axl::enc::Utf8,axl::enc::Utf8,axl::enc::ToLowerCase,axl::enc::Utf8Decoder>::CountingEmitter>
          (Utf8Dfa *this,CountingEmitter *emitter,utf8_t *p)

{
  uint_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  uint uVar4;
  
  uVar1 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_state;
  switch(uVar1 << 0x1d | uVar1 - 0x10 >> 3) {
  case 0:
  case 1:
    uVar4 = 0xc0;
    break;
  case 2:
  case 3:
    uVar4 = 0xe0;
    break;
  case 4:
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xe0;
    goto LAB_0011ef6d;
  default:
    goto switchD_0011ef33_caseD_5;
  case 6:
  case 7:
    uVar4 = 0xf0;
    break;
  case 8:
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xf0;
LAB_0011ef6d:
    uVar2 = toLowerCase(uVar4);
    sVar3 = Utf8Encoder::getEncodeLength(uVar2,emitter->m_replacement);
    emitter->m_length = emitter->m_length + sVar3;
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0x3fU | 0x80;
    goto LAB_0011efd9;
  case 10:
    uVar2 = toLowerCase((this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 0xc |
                        0xf0);
    sVar3 = Utf8Encoder::getEncodeLength(uVar2,emitter->m_replacement);
    emitter->m_length = emitter->m_length + sVar3;
    uVar2 = toLowerCase((uint)(this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6
                        & 0x3f | 0x80);
    sVar3 = Utf8Encoder::getEncodeLength(uVar2,emitter->m_replacement);
    emitter->m_length = emitter->m_length + sVar3;
    uVar4 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp & 0x3fU | 0x80;
    goto LAB_0011efd9;
  }
  uVar4 = uVar4 | (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp;
LAB_0011efd9:
  uVar2 = toLowerCase(uVar4);
  sVar3 = Utf8Encoder::getEncodeLength(uVar2,emitter->m_replacement);
  emitter->m_length = emitter->m_length + sVar3;
switchD_0011ef33_caseD_5:
  return;
}

Assistant:

void
	emitPendingCus(
		Emitter& emitter,
		const utf8_t* p
	) {
		switch (m_state) {
		case State_1_2:
		case State_1_2_Error:
			emitter.emitCu(p, 0xc0 | m_cp);
			break;

		case State_1_3:
		case State_1_3_Error:
			emitter.emitCu(p, 0xe0 | m_cp);
			break;

		case State_2_3:
			emitter.emitCu(p - 1, 0xe0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_1_4:
		case State_1_4_Error:
			emitter.emitCu(p, 0xf0 | m_cp);
			break;

		case State_2_4:
			emitter.emitCu(p - 1, 0xf0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_3_4:
			emitter.emitCu(p - 2, 0xf0 | (m_cp >> 12));
			emitter.emitCu(p - 1, 0x80 | ((m_cp >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;
		}
	}